

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void ParseLineSafe(bool parselabels)

{
  char *pcVar1;
  char *rp;
  char *tmp2;
  char *tmp;
  bool parselabels_local;
  
  pcVar1 = lp;
  tmp2 = (char *)0x0;
  rp = (char *)0x0;
  if (('\0' < sline[0]) && (tmp2 = strdup(sline), tmp2 == (char *)0x0)) {
    ErrorOOM();
  }
  if (('\0' < sline2[0]) && (rp = strdup(sline2), rp == (char *)0x0)) {
    ErrorOOM();
  }
  ParseLine(parselabels);
  sline[0] = '\0';
  sline2[0] = '\0';
  if (rp != (char *)0x0) {
    strcpy(sline2,rp);
    free(rp);
  }
  if (tmp2 != (char *)0x0) {
    strcpy(sline,tmp2);
    free(tmp2);
  }
  lp = pcVar1;
  return;
}

Assistant:

void ParseLineSafe(bool parselabels) {
	char* tmp = NULL, * tmp2 = NULL;
	char* rp = lp;
	if (sline[0] > 0) {
		tmp = STRDUP(sline);
		if (tmp == NULL) ErrorOOM();
	}
	if (sline2[0] > 0) {
		tmp2 = STRDUP(sline2);
		if (tmp2 == NULL) ErrorOOM();
	}

	ParseLine(parselabels);

	*sline = 0;
	*sline2 = 0;

	if (tmp2 != NULL) {
		STRCPY(sline2, LINEMAX2, tmp2);
		free(tmp2);
	}
	if (tmp != NULL) {
		STRCPY(sline, LINEMAX2, tmp);
		free(tmp);
	}
	lp = rp;
}